

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileloader.cpp
# Opt level: O2

void file_loader(char *filename,
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *param,int *car_capacity,int *num_car)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  bool bVar6;
  string line;
  int tmp;
  vector<int,_std::allocator<int>_> tmp_vec;
  ifstream ifs;
  stringstream ss;
  stringstream ss_1;
  
  std::ifstream::ifstream(&ifs,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    iVar5 = 4;
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifs,(string *)&line);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifs,(string *)&line);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
    piVar2 = (istream *)std::istream::operator>>((istream *)&ss,num_car);
    std::istream::operator>>(piVar2,car_capacity);
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ifs,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar3);
      if (line._M_string_length - 0x42 < 10) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss_1,(string *)&line,_S_out|_S_in)
        ;
        tmp_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        tmp_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tmp_vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        while( true ) {
          plVar4 = (long *)std::istream::operator>>((istream *)&ss_1,&tmp);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &tmp_vec.super__Vector_base<int,_std::allocator<int>_>,&tmp);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(param,(value_type *)&tmp_vec.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&tmp_vec.super__Vector_base<int,_std::allocator<int>_>);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss_1);
      }
    }
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&ifs);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Error, cannot open file, check argv: ");
  poVar3 = std::operator<<(poVar3,filename);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void file_loader (const char *filename, 
				std::vector<std::vector<int> > &param, 
				int &car_capacity, int &num_car)
{
	//https://qiita.com/Reed_X1319RAY/items/098596cda78e9c1a6bad
	std::ifstream ifs(filename, std::ios::in);
	if(!ifs.is_open()){
		std::cerr << "Error, cannot open file, check argv: " << filename << std::endl;
		std::exit(1); 
	}
   std::string line;
   for(int i = 0; i < 4; i++){
   	std::getline(ifs, line);
   }
   std::getline(ifs, line);
   std::stringstream ss(line);
   ss >> num_car >> car_capacity;
   while (std::getline(ifs, line)){
   	std::cout << line.size() << std::endl;
	   if(66 <= line.size() && line.size() <= 75){
	    	std::stringstream ss(line);
	      std::vector<int> tmp_vec;
	      int tmp;
	      while (ss >> tmp){
	      	tmp_vec.push_back(tmp);
	      }
	      param.push_back(tmp_vec);
	   }
   }
   ifs.close();
}